

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O3

void __thiscall
implementations::brainfck::BFImplementation::BFImplementation(BFImplementation *this,env_p *_env)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  env_p local_20;
  
  peVar1 = (_env->
           super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  this_00 = (_env->
            super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    )._vptr_Implementation = (_func_int **)&PTR___cxa_pure_virtual_001309d8;
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    ).env.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    ).env.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00112dcd;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar2 = __libc_single_threaded != '\0';
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    )._vptr_Implementation = (_func_int **)&PTR___cxa_pure_virtual_001309d8;
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    ).env.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    ).env.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (bVar2) goto LAB_00112dc5;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    )._vptr_Implementation = (_func_int **)&PTR___cxa_pure_virtual_001309d8;
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    ).env.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (this->
    super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
    ).env.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
LAB_00112dc5:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
LAB_00112dcd:
  (this->
  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
  )._vptr_Implementation = (_func_int **)&PTR_getCurrentFrame_00130978;
  local_20.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (_env->
           super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  local_20.super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_env->
       super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_20.
      super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.
       super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.
            super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.
       super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_20.
            super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  BFFrame::BFFrame(&this->frame,&local_20);
  if (local_20.
      super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

BFImplementation(env_p _env) : Implementation(_env), frame(BFFrame(_env)) {
	}